

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O1

void golf_editor_draw(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int point1_idx;
  golf_level_t *level;
  golf_geo_t *pgVar6;
  golf_geo_point_t *pgVar7;
  golf_geo_face_t *pgVar8;
  int *piVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  mat4 m_03;
  mat4 m_04;
  mat4 m_05;
  mat4 m_06;
  mat4 m_07;
  mat4 m_08;
  mat4 m_09;
  mat4 m_10;
  mat4 m_11;
  mat4 m_12;
  mat4 m_13;
  mat4 m_14;
  mat4 m_15;
  mat4 m_16;
  mat4 m_17;
  mat4 m_18;
  mat4 m_19;
  mat4 m_20;
  mat4 m_21;
  mat4 m_22;
  mat4 m1;
  mat4 m_23;
  mat4 m_24;
  mat4 m_25;
  mat4 m_26;
  mat4 m_27;
  mat4 m_28;
  mat4 m_29;
  mat4 m_30;
  mat4 m_31;
  golf_movement_t movement;
  mat4 m2;
  vec3 v;
  vec3 v_00;
  quat q;
  vec3 v_01;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined3 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  wchar_t base_element;
  _Bool _Var17;
  golf_config_t *cfg;
  golf_transform_t *pgVar18;
  golf_movement_t *pgVar19;
  ulong uVar20;
  golf_model_t *pgVar21;
  golf_texture_t *pgVar22;
  golf_shader_t *pgVar23;
  golf_shader_pipeline_t *pgVar24;
  golf_shader_uniform_t *pgVar25;
  golf_shader_uniform_t *uniform;
  golf_texture_t *pgVar26;
  golf_texture_t *pgVar27;
  golf_lightmap_section_t *pgVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  golf_model_group_t *pgVar32;
  char *pcVar33;
  golf_material_t *pgVar34;
  mat4 *pmVar35;
  undefined8 *puVar36;
  uint uVar37;
  int iVar38;
  golf_entity_t *pgVar39;
  long lVar40;
  bool bVar41;
  byte bVar42;
  float fVar43;
  float fVar44;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar45;
  vec3 vVar46;
  vec3 v_02;
  vec3 v_03;
  vec3 vVar47;
  vec4 vVar48;
  golf_edit_mode_entity_t gVar49;
  vec3 p1;
  int start_vertex;
  mat4 rotation_mat;
  golf_transform_t transform;
  golf_model_t *model;
  golf_transform_t transform_2;
  golf_transform_t transform_3;
  golf_transform_t world_transform;
  golf_lightmap_image_t lightmap_image;
  golf_transform_t world_transform_1;
  golf_model_group_t group;
  golf_transform_t moved_transform;
  mat4 model_mat;
  sg_pass_action action;
  golf_transform_t in_stack_ffffffffffffeb60;
  float local_11a8;
  float fStack_11a4;
  undefined8 local_1198;
  undefined1 local_1148 [16];
  sg_buffer local_1138 [2];
  sg_buffer asStack_1130 [2];
  char local_1128 [8];
  int aiStack_1120 [2];
  int local_1118 [2];
  int aiStack_1110 [2];
  golf_lightmap_section_t *local_1108;
  golf_texture_t *local_1100;
  mat4 local_10f8;
  golf_transform_t local_10b8;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  golf_model_t *local_1070;
  undefined1 local_1068 [16];
  long local_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined4 local_1008;
  float fStack_1004;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  sg_range local_fe0;
  sg_range local_fd0;
  sg_range local_fc0;
  sg_range local_fb0;
  sg_range local_fa0;
  sg_range local_f90;
  sg_range local_f80;
  sg_range local_f70;
  sg_range local_f60;
  sg_range local_f50;
  sg_range local_f40;
  mat4 local_f30;
  sg_range local_ef0;
  sg_range local_ee0;
  golf_lightmap_image_t local_ed0;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  golf_transform_t local_de0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  mat4 local_da0;
  mat4 local_d60;
  mat4 local_d20;
  wchar_t local_ce0;
  undefined4 local_cdc;
  mat4 local_cd8;
  mat4 local_c98;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  mat4 local_b98;
  mat4 local_b58;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  mat4 local_a98;
  mat4 local_a58;
  mat4 local_a18;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined1 local_958 [8];
  sg_buffer sStack_950;
  sg_buffer sStack_94c;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  int aiStack_930 [10];
  undefined8 local_908;
  anon_union_1032_2_6556a3fb_for_golf_material_6 aStack_900;
  undefined1 local_4f8 [8];
  sg_buffer sStack_4f0;
  sg_buffer sStack_4ec;
  sg_buffer local_4e8 [2];
  sg_buffer asStack_4e0 [2];
  char local_4d8 [8];
  int aiStack_4d0 [2];
  int local_4c8 [2];
  int aiStack_4c0 [266];
  sg_pass_action local_98;
  vec3 v_04;
  
  bVar42 = 0;
  cfg = golf_data_get_config("data/config/editor.cfg");
  local_98.colors[0].value.r = 0.0;
  local_98.colors[0].value.g = 0.0;
  local_98.colors[1].action = _SG_ACTION_DEFAULT;
  local_98.colors[1].value.r = 0.0;
  local_98.colors[3].value.a = 0.0;
  local_98.depth.action = _SG_ACTION_DEFAULT;
  local_98.depth.value = 0.0;
  local_98.stencil.action = _SG_ACTION_DEFAULT;
  local_98.colors[3].action = _SG_ACTION_DEFAULT;
  local_98.colors[3].value.r = 0.0;
  local_98.colors[3].value.g = 0.0;
  local_98.colors[3].value.b = 0.0;
  local_98.colors[2].value.r = 0.0;
  local_98.colors[2].value.g = 0.0;
  local_98.colors[2].value.b = 0.0;
  local_98.colors[2].value.a = 0.0;
  local_98.colors[1].value.g = 0.0;
  local_98.colors[1].value.b = 0.0;
  local_98.colors[1].value.a = 0.0;
  local_98.colors[2].action = _SG_ACTION_DEFAULT;
  local_98.stencil.value = '\0';
  local_98.stencil._5_3_ = 0;
  local_98._end_canary = 0;
  local_98._start_canary = 0;
  local_98.colors[0].action = SG_ACTION_CLEAR;
  local_98.colors[0].value.b = 0.0;
  local_98.colors[0].value.a = 1.0;
  sg_begin_default_pass(&local_98,(int)(graphics->viewport_size).x,(int)(graphics->viewport_size).y)
  ;
  level = editor->level;
  if (0 < (level->entities).length) {
    lVar31 = 0;
    do {
      pgVar39 = (level->entities).data;
      if (pgVar39[lVar31].active == true) {
        pgVar39 = pgVar39 + lVar31;
        if (((WATER_ENTITY < pgVar39->type) || ((0x16U >> (pgVar39->type & 0x1f) & 1) == 0)) &&
           (pgVar21 = golf_entity_get_model(pgVar39), pgVar21 != (golf_model_t *)0x0)) {
          fVar44 = 1.0;
          if (pgVar39->type == MODEL_ENTITY) {
            fVar44 = (pgVar39->field_4).model.uv_scale;
          }
          pgVar18 = golf_entity_get_transform(pgVar39);
          if (pgVar18 != (golf_transform_t *)0x0) {
            golf_entity_get_world_transform((golf_transform_t *)&local_f30,level,pgVar39);
            pgVar19 = golf_entity_get_movement(pgVar39);
            if (pgVar19 == (golf_movement_t *)0x0) {
              golf_transform_get_model_mat(in_stack_ffffffffffffeb60);
              local_1118[0] = aiStack_930[2];
              local_1118[1] = aiStack_930[3];
              aiStack_1110[0] = aiStack_930[4];
              aiStack_1110[1] = aiStack_930[5];
              local_1128._0_4_ = (float)local_938;
              local_1128._4_4_ = local_938._4_4_;
              aiStack_1120[0] = aiStack_930[0];
              aiStack_1120[1] = aiStack_930[1];
              local_1138[0].id = (uint32_t)(float)local_948;
              local_1138[1].id = (uint32_t)local_948._4_4_;
              asStack_1130[0].id = uStack_940._0_4_;
              asStack_1130[1].id = uStack_940._4_4_;
              local_1148._0_8_ = local_958;
              local_1148._8_4_ = sStack_950.id;
              local_1148._12_4_ = sStack_94c.id;
            }
            else {
              local_4d8 = *(char (*) [8])((long)&pgVar19->field_4 + 0x10);
              local_4f8 = *(undefined1 (*) [8])pgVar19;
              sStack_4f0.id = (uint32_t)pgVar19->t0;
              sStack_4ec.id = (uint32_t)pgVar19->length;
              uVar12 = pgVar19->type;
              uVar13 = pgVar19->repeats;
              uVar14 = *(undefined3 *)&pgVar19->field_0x5;
              uVar15 = pgVar19->t0;
              movement.t0 = (float)uVar15;
              movement._5_3_ = uVar14;
              movement.repeats = (_Bool)uVar13;
              movement.type = uVar12;
              local_4e8 = *(sg_buffer (*) [2])&pgVar19->field_4;
              asStack_4e0 = *(sg_buffer (*) [2])((long)&pgVar19->field_4 + 8);
              transform_00.position.y = local_f30.m[1];
              transform_00.position.x = local_f30.m[0];
              transform_00.position.z = local_f30.m[2];
              transform_00.rotation.x = local_f30.m[3];
              transform_00.rotation.y = local_f30.m[4];
              transform_00.rotation.z = local_f30.m[5];
              transform_00.rotation.w = local_f30.m[6];
              transform_00.scale.x = local_f30.m[7];
              transform_00.scale.y = local_f30.m[8];
              transform_00.scale.z = local_f30.m[9];
              movement.length = (float)sStack_4ec.id;
              movement.field_4.linear.p0.x = (float)local_4e8[0].id;
              movement.field_4.linear.p0.y = (float)local_4e8[1].id;
              movement.field_4._8_4_ = asStack_4e0[0].id;
              movement.field_4._12_4_ = asStack_4e0[1].id;
              movement.field_4._16_1_ = local_4d8[0];
              movement.field_4._17_1_ = local_4d8[1];
              movement.field_4._18_1_ = local_4d8[2];
              movement.field_4._19_1_ = local_4d8[3];
              movement.field_4._20_1_ = local_4d8[4];
              movement.field_4._21_1_ = local_4d8[5];
              movement.field_4._22_1_ = local_4d8[6];
              movement.field_4._23_1_ = local_4d8[7];
              golf_transform_apply_movement
                        ((golf_transform_t *)local_958,transform_00,movement,editor->t);
              golf_transform_get_model_mat(in_stack_ffffffffffffeb60);
            }
            if (0 < (pgVar21->groups).length) {
              lVar40 = 0;
              do {
                pgVar32 = (pgVar21->groups).data + lVar40;
                pmVar35 = &local_d20;
                for (lVar30 = 0x12; lVar30 != 0; lVar30 = lVar30 + -1) {
                  pmVar35->m[0] = *(float *)pgVar32->material_name;
                  pgVar32 = (golf_model_group_t *)((long)pgVar32 + ((ulong)bVar42 * -2 + 1) * 4);
                  pmVar35 = (mat4 *)((long)pmVar35 + (ulong)bVar42 * -8 + 4);
                }
                _Var17 = golf_level_get_material
                                   (level,(char *)&local_d20,(golf_material_t *)local_958);
                if (!_Var17) {
                  golf_log_warning("Could not find material %s",&local_d20);
                  golf_material_texture
                            ((golf_material_t *)local_4f8,"",0.0,0.0,0.0,
                             "data/textures/fallback.png");
                  memcpy(local_958,(golf_material_t *)local_4f8,0x460);
                }
                if (local_908._0_4_ == GOLF_MATERIAL_ENVIRONMENT) {
                  pgVar28 = golf_entity_get_lightmap_section(pgVar39);
                  if (pgVar28 == (golf_lightmap_section_t *)0x0) {
                    golf_log_warning("Cannot use environment material on entity with no lightmap");
                  }
                  else {
                    _Var17 = golf_level_get_lightmap_image(level,pgVar28->lightmap_name,&local_ed0);
                    base_element = local_ce0;
                    if (_Var17) {
                      local_1068._0_4_ = local_cdc;
                      local_1100 = aStack_900.field_0.texture;
                      local_10f8.m[0] = (float)local_1148._0_4_;
                      local_10f8.m[1] = (float)local_1148._4_4_;
                      local_10f8.m[2] = (float)local_1148._8_8_;
                      local_10f8.m[3] = SUB84(local_1148._8_8_,4);
                      local_10f8.m[4] = (float)local_1138[0].id;
                      local_10f8.m[5] = (float)local_1138[1].id;
                      local_10f8.m[6] = (float)asStack_1130[0].id;
                      local_10f8.m[7] = (float)asStack_1130[1].id;
                      local_10f8.m._32_8_ = local_1128;
                      local_10f8.m[10] = (float)aiStack_1120[0];
                      local_10f8.m[0xb] = (float)aiStack_1120[1];
                      local_10f8.m[0xc] = (float)local_1118[0];
                      local_10f8.m[0xd] = (float)local_1118[1];
                      local_10f8.m[0xe] = (float)aiStack_1110[0];
                      local_10f8.m[0xf] = (float)aiStack_1110[1];
                      local_1108 = pgVar28;
                      pgVar23 = golf_data_get_shader("data/shaders/environment_material.glsl");
                      pgVar24 = golf_shader_get_pipeline(pgVar23,"environment_material");
                      sg_apply_pipeline((sg_pipeline)(pgVar24->sg_pipeline).id);
                      pgVar25 = golf_shader_get_vs_uniform(pgVar23,"environment_material_vs_params")
                      ;
                      local_4f8 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
                      _sStack_4f0 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
                      local_4e8 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 4);
                      asStack_4e0 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 6);
                      local_4d8 = *(char (*) [8])((graphics->proj_view_mat).m + 8);
                      aiStack_4d0 = *(int (*) [2])((graphics->proj_view_mat).m + 10);
                      local_4c8 = *(int (*) [2])((graphics->proj_view_mat).m + 0xc);
                      aiStack_4c0._0_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
                      m.m[3] = (float)SUB84(_sStack_4f0,4);
                      m.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
                      m.m[4] = (float)local_4e8[0].id;
                      m.m[5] = (float)local_4e8[1].id;
                      m.m[6] = (float)asStack_4e0[0].id;
                      m.m[7] = (float)asStack_4e0[1].id;
                      m.m[8] = (float)local_4d8._0_4_;
                      m.m[9] = (float)local_4d8._4_4_;
                      m.m[10] = (float)aiStack_4d0[0];
                      m.m[0xb] = (float)aiStack_4d0[1];
                      m.m[0xc] = (float)local_4c8[0];
                      m.m[0xd] = (float)local_4c8[1];
                      m.m[0xe] = (float)(int)aiStack_4c0._0_8_;
                      m.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
                      mat4_transpose(m);
                      m_00.m[2] = (float)(int)uStack_e18;
                      m_00.m[0] = (float)(undefined4)local_e20;
                      m_00.m[1] = (float)local_e20._4_4_;
                      m_00.m[3] = (float)(int)((ulong)uStack_e18 >> 0x20);
                      m_00.m[4] = (float)(int)local_e10;
                      m_00.m[5] = (float)(int)((ulong)local_e10 >> 0x20);
                      m_00.m[6] = (float)(int)uStack_e08;
                      m_00.m[7] = (float)(int)((ulong)uStack_e08 >> 0x20);
                      m_00.m[8] = (float)(int)local_e00;
                      m_00.m[9] = (float)(int)((ulong)local_e00 >> 0x20);
                      m_00.m[10] = (float)(int)uStack_df8;
                      m_00.m[0xb] = (float)(int)((ulong)uStack_df8 >> 0x20);
                      m_00.m[0xc] = (float)(int)local_df0;
                      m_00.m[0xd] = (float)(int)((ulong)local_df0 >> 0x20);
                      m_00.m[0xe] = (float)(int)uStack_de8;
                      m_00.m[0xf] = (float)((ulong)uStack_de8 >> 0x20);
                      golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_00);
                      m_01.m[2] = local_10f8.m[2];
                      m_01.m[0] = local_10f8.m[0];
                      m_01.m[1] = local_10f8.m[1];
                      m_01.m[3] = local_10f8.m[3];
                      m_01.m[4] = local_10f8.m[4];
                      m_01.m[5] = local_10f8.m[5];
                      m_01.m[6] = (float)local_10f8.m[6];
                      m_01.m[7] = (float)local_10f8.m[7];
                      m_01.m[8] = local_10f8.m[8];
                      m_01.m[9] = local_10f8.m[9];
                      m_01.m[10] = (float)local_10f8.m[10];
                      m_01.m[0xb] = (float)local_10f8.m[0xb];
                      m_01.m[0xc] = (float)local_10f8.m[0xc];
                      m_01.m[0xd] = (float)local_10f8.m[0xd];
                      m_01.m[0xe] = (float)local_10f8.m[0xe];
                      m_01.m[0xf] = local_10f8.m[0xf];
                      mat4_transpose(m_01);
                      m_02.m[2] = (float)(int)uStack_e58;
                      m_02.m[0] = (float)(undefined4)local_e60;
                      m_02.m[1] = (float)local_e60._4_4_;
                      m_02.m[3] = (float)(int)((ulong)uStack_e58 >> 0x20);
                      m_02.m[4] = (float)(int)local_e50;
                      m_02.m[5] = (float)(int)((ulong)local_e50 >> 0x20);
                      m_02.m[6] = (float)(int)uStack_e48;
                      m_02.m[7] = (float)(int)((ulong)uStack_e48 >> 0x20);
                      m_02.m[8] = (float)(int)local_e40;
                      m_02.m[9] = (float)(int)((ulong)local_e40 >> 0x20);
                      m_02.m[10] = (float)(int)uStack_e38;
                      m_02.m[0xb] = (float)(int)((ulong)uStack_e38 >> 0x20);
                      m_02.m[0xc] = (float)(int)local_e30;
                      m_02.m[0xd] = (float)(int)((ulong)local_e30 >> 0x20);
                      m_02.m[0xe] = (float)(int)uStack_e28;
                      m_02.m[0xf] = (float)((ulong)uStack_e28 >> 0x20);
                      golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_02);
                      local_d60.m._0_8_ = pgVar25->data;
                      local_d60.m._8_8_ = SEXT48(pgVar25->size);
                      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',(sg_range *)&local_d60);
                      iVar5 = local_ed0.num_samples;
                      if (local_ed0.num_samples < 2 || local_ed0.time_length <= 0.0) {
                        uVar20 = 0;
                        lVar30 = 0;
                        fVar43 = 0.0;
                      }
                      else {
                        fVar43 = fmodf(editor->t,local_ed0.time_length);
                        fVar43 = fVar43 / local_ed0.time_length;
                        if ((local_ed0.repeats == true) && (fVar43 = fVar43 + fVar43, 1.0 < fVar43))
                        {
                          fVar43 = 2.0 - fVar43;
                        }
                        uVar37 = 1;
                        do {
                          if (fVar43 < (float)(int)uVar37 / (float)(int)(iVar5 - 1)) {
                            iVar38 = uVar37 - 1;
                            goto LAB_0010e0c4;
                          }
                          uVar37 = uVar37 + 1;
                        } while (iVar5 != uVar37);
                        uVar37 = 0;
                        iVar38 = 0;
LAB_0010e0c4:
                        fVar45 = (float)iVar38 / ((float)iVar5 + -1.0);
                        fVar43 = golf_clampf((fVar43 - fVar45) /
                                             ((float)(int)uVar37 / ((float)iVar5 + -1.0) - fVar45),
                                             0.0,1.0);
                        lVar30 = (long)iVar38;
                        uVar20 = (ulong)uVar37;
                      }
                      pgVar25 = golf_shader_get_fs_uniform(pgVar23,"environment_material_fs_params")
                      ;
                      vVar48 = vec4_create(0.0,0.0,0.0,0.0);
                      golf_shader_uniform_set_vec4(pgVar25,"ball_position",vVar48);
                      golf_shader_uniform_set_float(pgVar25,"lightmap_texture_a",fVar43);
                      golf_shader_uniform_set_float(pgVar25,"uv_scale",fVar44);
                      local_da0.m._0_8_ = pgVar25->data;
                      local_da0.m._8_8_ = SEXT48(pgVar25->size);
                      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',(sg_range *)&local_da0);
                      memset((sg_bindings *)local_4f8,0,0xb0);
                      local_4f8._4_4_ = (pgVar21->sg_positions_buf).id;
                      sStack_4ec.id = (pgVar21->sg_normals_buf).id;
                      sStack_4f0.id = (pgVar21->sg_texcoords_buf).id;
                      local_4e8[0].id = (local_1108->sg_uvs_buf).id;
                      aiStack_4c0[0x11] = (local_1100->sg_image).id;
                      aiStack_4c0[0x12] = local_ed0.sg_image[lVar30].id;
                      aiStack_4c0[0x13] = local_ed0.sg_image[uVar20].id;
                      sg_apply_bindings((sg_bindings *)local_4f8);
                      sg_draw(base_element,local_1068._0_4_,L'\x01');
                    }
                    else {
                      golf_log_warning("Could not find lightmap %s",pgVar28);
                    }
                  }
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 < (pgVar21->groups).length);
            }
          }
        }
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < (level->entities).length);
  }
  if (0 < (level->entities).length) {
    lVar40 = 0;
    lVar31 = 0;
    do {
      pgVar39 = (level->entities).data;
      if (((editor->entity_settings).draw_camera_zones == true) &&
         (*(int *)(pgVar39->name + lVar40 + -4) == 7)) {
        golf_entity_get_world_transform
                  (&local_10b8,level,(golf_entity_t *)(pgVar39->name + lVar40 + -0xc));
        vVar47.z = local_10b8.position.z;
        vVar47.x = local_10b8.position.x;
        vVar47.y = local_10b8.position.y;
        mat4_translation((mat4 *)&local_ed0,vVar47);
        v_01.y = local_10b8.scale.y;
        v_01.z = local_10b8.scale.z;
        v_01.x = local_10b8.scale.x;
        mat4_scale(&local_d20,v_01);
        mat4_multiply_n((mat4 *)local_4f8,2);
        pgVar21 = golf_data_get_model("data/models/cube.obj");
        pgVar22 = golf_data_get_texture("data/textures/colors/red.png");
        pgVar23 = golf_data_get_shader("data/shaders/texture_material.glsl");
        pgVar24 = golf_shader_get_pipeline(pgVar23,"texture_material");
        sg_apply_pipeline((sg_pipeline)(pgVar24->sg_pipeline).id);
        pgVar25 = golf_shader_get_vs_uniform(pgVar23,"texture_material_vs_params");
        local_958 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
        _sStack_950 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_948._0_4_ = (graphics->proj_view_mat).m[4];
        local_948._4_4_ = (graphics->proj_view_mat).m[5];
        uStack_940 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_938._0_4_ = (graphics->proj_view_mat).m[8];
        local_938._4_4_ = (graphics->proj_view_mat).m[9];
        aiStack_930._0_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        aiStack_930._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
        aiStack_930._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        m_03.m[3] = (float)SUB84(_sStack_950,4);
        m_03.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m_03.m[4] = (float)local_948;
        m_03.m[5] = local_948._4_4_;
        m_03.m[6] = (float)(uint32_t)uStack_940;
        m_03.m[7] = (float)SUB84(uStack_940,4);
        m_03.m[8] = (float)local_938;
        m_03.m[9] = local_938._4_4_;
        m_03.m[10] = (float)(int)aiStack_930._0_8_;
        m_03.m[0xb] = (float)SUB84(aiStack_930._0_8_,4);
        m_03.m[0xc] = (float)(int)aiStack_930._8_8_;
        m_03.m[0xd] = (float)SUB84(aiStack_930._8_8_,4);
        m_03.m[0xe] = (float)(int)aiStack_930._16_8_;
        m_03.m[0xf] = SUB84(aiStack_930._16_8_,4);
        mat4_transpose(m_03);
        m_04.m[2] = (float)(int)uStack_e18;
        m_04.m[0] = (float)(undefined4)local_e20;
        m_04.m[1] = (float)local_e20._4_4_;
        m_04.m[3] = (float)(int)((ulong)uStack_e18 >> 0x20);
        m_04.m[4] = (float)(int)local_e10;
        m_04.m[5] = (float)(int)((ulong)local_e10 >> 0x20);
        m_04.m[6] = (float)(int)uStack_e08;
        m_04.m[7] = (float)(int)((ulong)uStack_e08 >> 0x20);
        m_04.m[8] = (float)(int)local_e00;
        m_04.m[9] = (float)(int)((ulong)local_e00 >> 0x20);
        m_04.m[10] = (float)(int)uStack_df8;
        m_04.m[0xb] = (float)(int)((ulong)uStack_df8 >> 0x20);
        m_04.m[0xc] = (float)(int)local_df0;
        m_04.m[0xd] = (float)(int)((ulong)local_df0 >> 0x20);
        m_04.m[0xe] = (float)(int)uStack_de8;
        m_04.m[0xf] = (float)((ulong)uStack_de8 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_04);
        m_05.m[2] = (float)(uint32_t)_sStack_4f0;
        m_05.m[0] = (float)local_4f8._0_4_;
        m_05.m[1] = (float)local_4f8._4_4_;
        m_05.m[3] = (float)SUB84(_sStack_4f0,4);
        m_05.m[4] = (float)local_4e8[0].id;
        m_05.m[5] = (float)local_4e8[1].id;
        m_05.m[6] = (float)asStack_4e0[0].id;
        m_05.m[7] = (float)asStack_4e0[1].id;
        m_05.m[8] = (float)local_4d8._0_4_;
        m_05.m[9] = (float)local_4d8._4_4_;
        m_05.m[10] = (float)aiStack_4d0[0];
        m_05.m[0xb] = (float)aiStack_4d0[1];
        m_05.m[0xc] = (float)local_4c8[0];
        m_05.m[0xd] = (float)local_4c8[1];
        m_05.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_05.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_05);
        m_06.m[2] = (float)(int)uStack_e58;
        m_06.m[0] = (float)(undefined4)local_e60;
        m_06.m[1] = (float)local_e60._4_4_;
        m_06.m[3] = (float)(int)((ulong)uStack_e58 >> 0x20);
        m_06.m[4] = (float)(int)local_e50;
        m_06.m[5] = (float)(int)((ulong)local_e50 >> 0x20);
        m_06.m[6] = (float)(int)uStack_e48;
        m_06.m[7] = (float)(int)((ulong)uStack_e48 >> 0x20);
        m_06.m[8] = (float)(int)local_e40;
        m_06.m[9] = (float)(int)((ulong)local_e40 >> 0x20);
        m_06.m[10] = (float)(int)uStack_e38;
        m_06.m[0xb] = (float)(int)((ulong)uStack_e38 >> 0x20);
        m_06.m[0xc] = (float)(int)local_e30;
        m_06.m[0xd] = (float)(int)((ulong)local_e30 >> 0x20);
        m_06.m[0xe] = (float)(int)uStack_e28;
        m_06.m[0xf] = (float)((ulong)uStack_e28 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_06);
        local_ee0.ptr = pgVar25->data;
        local_ee0.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_ee0);
        uniform = golf_shader_get_fs_uniform(pgVar23,"fs_params");
        golf_shader_uniform_set_float(uniform,"alpha",0.4);
        local_ef0.ptr = uniform->data;
        local_ef0.size = (size_t)uniform->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_ef0);
        memset((sg_bindings *)local_958,0,0xb0);
        local_958._4_4_ = (pgVar21->sg_positions_buf).id;
        sStack_94c.id = (pgVar21->sg_normals_buf).id;
        sStack_950.id = (pgVar21->sg_texcoords_buf).id;
        aStack_900._36_4_ = (pgVar22->sg_image).id;
        sg_apply_bindings((sg_bindings *)local_958);
        sg_draw(L'\0',(pgVar21->positions).length,L'\x01');
        q.y = local_10b8.rotation.y;
        q.z = local_10b8.rotation.z;
        q.x = local_10b8.rotation.x;
        q.w = local_10b8.rotation.w;
        mat4_from_quat(&local_10f8,q);
        v.z = local_10b8.position.z;
        v.x = local_10b8.position.x;
        v.y = local_10b8.position.y;
        mat4_translation(&local_f30,v);
        vVar46 = vec3_create(1.0,0.1,0.1);
        mat4_scale(&local_d60,vVar46);
        vVar46 = vec3_create(1.0,0.5,0.0);
        mat4_translation(&local_da0,vVar46);
        mat4_multiply_n((mat4 *)local_1148,4);
        local_4c8[0] = local_1118[0];
        local_4c8[1] = local_1118[1];
        aiStack_4c0[0] = aiStack_1110[0];
        aiStack_4c0[1] = aiStack_1110[1];
        local_4d8[0] = local_1128[0];
        local_4d8[1] = local_1128[1];
        local_4d8[2] = local_1128[2];
        local_4d8[3] = local_1128[3];
        local_4d8[4] = local_1128[4];
        local_4d8[5] = local_1128[5];
        local_4d8[6] = local_1128[6];
        local_4d8[7] = local_1128[7];
        aiStack_4d0[0] = aiStack_1120[0];
        aiStack_4d0[1] = aiStack_1120[1];
        local_4e8[0].id = local_1138[0].id;
        local_4e8[1].id = local_1138[1].id;
        asStack_4e0[0].id = asStack_1130[0].id;
        asStack_4e0[1].id = asStack_1130[1].id;
        local_4f8 = (undefined1  [8])local_1148._0_8_;
        sStack_4f0.id = local_1148._8_4_;
        sStack_4ec.id = local_1148._12_4_;
        local_1148._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
        local_1148._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_1138 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 4);
        asStack_1130 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 6);
        local_1128 = *(char (*) [8])((graphics->proj_view_mat).m + 8);
        aiStack_1120 = *(int (*) [2])((graphics->proj_view_mat).m + 10);
        local_1118 = *(int (*) [2])((graphics->proj_view_mat).m + 0xc);
        aiStack_1110 = *(int (*) [2])((graphics->proj_view_mat).m + 0xe);
        m_07.m[3] = (float)SUB84(local_1148._8_8_,4);
        m_07.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m_07.m[4] = (float)local_1138[0].id;
        m_07.m[5] = (float)local_1138[1].id;
        m_07.m[6] = (float)asStack_1130[0].id;
        m_07.m[7] = (float)asStack_1130[1].id;
        m_07.m[8] = (float)local_1128._0_4_;
        m_07.m[9] = (float)local_1128._4_4_;
        m_07.m[10] = (float)aiStack_1120[0];
        m_07.m[0xb] = (float)aiStack_1120[1];
        m_07.m[0xc] = (float)local_1118[0];
        m_07.m[0xd] = (float)local_1118[1];
        m_07.m[0xe] = (float)aiStack_1110[0];
        m_07.m[0xf] = aiStack_1110[1];
        mat4_transpose(m_07);
        m_08.m[2] = (float)(int)uStack_990;
        m_08.m[0] = (float)(undefined4)local_998;
        m_08.m[1] = (float)local_998._4_4_;
        m_08.m[3] = (float)(int)((ulong)uStack_990 >> 0x20);
        m_08.m[4] = (float)(int)local_988;
        m_08.m[5] = (float)(int)((ulong)local_988 >> 0x20);
        m_08.m[6] = (float)(int)uStack_980;
        m_08.m[7] = (float)(int)((ulong)uStack_980 >> 0x20);
        m_08.m[8] = (float)(int)local_978;
        m_08.m[9] = (float)(int)((ulong)local_978 >> 0x20);
        m_08.m[10] = (float)(int)uStack_970;
        m_08.m[0xb] = (float)(int)((ulong)uStack_970 >> 0x20);
        m_08.m[0xc] = (float)(int)local_968;
        m_08.m[0xd] = (float)(int)((ulong)local_968 >> 0x20);
        m_08.m[0xe] = (float)(int)uStack_960;
        m_08.m[0xf] = (float)((ulong)uStack_960 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_08);
        m_09.m[2] = (float)(uint32_t)_sStack_4f0;
        m_09.m[0] = (float)local_4f8._0_4_;
        m_09.m[1] = (float)local_4f8._4_4_;
        m_09.m[3] = (float)SUB84(_sStack_4f0,4);
        m_09.m[4] = local_4e8[0].id;
        m_09.m[5] = local_4e8[1].id;
        m_09.m[6] = (float)asStack_4e0[0].id;
        m_09.m[7] = (float)asStack_4e0[1].id;
        m_09.m[8] = local_4d8._0_4_;
        m_09.m[9] = local_4d8._4_4_;
        m_09.m[10] = (float)aiStack_4d0[0];
        m_09.m[0xb] = (float)aiStack_4d0[1];
        m_09.m[0xc] = (float)local_4c8[0];
        m_09.m[0xd] = (float)local_4c8[1];
        m_09.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_09.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_09);
        m_10.m[2] = (float)(int)uStack_9d0;
        m_10.m[0] = (float)(undefined4)local_9d8;
        m_10.m[1] = (float)local_9d8._4_4_;
        m_10.m[3] = (float)(int)((ulong)uStack_9d0 >> 0x20);
        m_10.m[4] = (float)(int)local_9c8;
        m_10.m[5] = (float)(int)((ulong)local_9c8 >> 0x20);
        m_10.m[6] = (float)(int)uStack_9c0;
        m_10.m[7] = (float)(int)((ulong)uStack_9c0 >> 0x20);
        m_10.m[8] = (float)(int)local_9b8;
        m_10.m[9] = (float)(int)((ulong)local_9b8 >> 0x20);
        m_10.m[10] = (float)(int)uStack_9b0;
        m_10.m[0xb] = (float)(int)((ulong)uStack_9b0 >> 0x20);
        m_10.m[0xc] = (float)(int)local_9a8;
        m_10.m[0xd] = (float)(int)((ulong)local_9a8 >> 0x20);
        m_10.m[0xe] = (float)(int)uStack_9a0;
        m_10.m[0xf] = (float)((ulong)uStack_9a0 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_10);
        local_f40.ptr = pgVar25->data;
        local_f40.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f40);
        golf_shader_uniform_set_float(uniform,"alpha",1.0);
        local_f50.ptr = uniform->data;
        local_f50.size = (size_t)uniform->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f50);
        aStack_900._36_4_ = (pgVar22->sg_image).id;
        local_958 = (undefined1  [8])((ulong)(pgVar21->sg_positions_buf).id << 0x20);
        sStack_94c.id = (pgVar21->sg_normals_buf).id;
        sStack_950.id = (pgVar21->sg_texcoords_buf).id;
        aStack_900._24_4_ = 0;
        aStack_900._28_8_ = 0;
        aStack_900._8_8_ = 0;
        aStack_900._16_4_ = 0;
        aStack_900._20_4_ = 0;
        local_908._0_4_ = 0;
        local_908._4_4_ = 0;
        aStack_900._0_8_ = 0;
        aiStack_930._24_8_ = 0;
        aiStack_930[8] = 0;
        aiStack_930[9] = 0;
        aiStack_930[2] = 0;
        aiStack_930[3] = 0;
        aiStack_930[4] = 0;
        aiStack_930[5] = 0;
        local_938._0_4_ = 0.0;
        local_938._4_4_ = 0.0;
        aiStack_930[0] = 0;
        aiStack_930[1] = 0;
        local_948._0_4_ = 0.0;
        local_948._4_4_ = 0.0;
        uStack_940._0_4_ = 0;
        uStack_940._4_4_ = 0;
        aStack_900._72_8_ = 0;
        aStack_900._80_8_ = 0;
        aStack_900._56_8_ = 0;
        aStack_900._64_8_ = 0;
        aStack_900._40_8_ = 0;
        aStack_900._48_8_ = 0;
        sg_apply_bindings((sg_bindings *)local_958);
        sg_draw(L'\0',(pgVar21->positions).length,L'\x01');
        pgVar21 = golf_data_get_model("data/models/sphere.obj");
        v_00.z = local_10b8.position.z;
        v_00.x = local_10b8.position.x;
        v_00.y = local_10b8.position.y;
        mat4_translation(&local_a18,v_00);
        vVar46 = vec3_create(2.0,0.1,0.0);
        mat4_translation(&local_a58,vVar46);
        vVar46 = vec3_create(0.2,0.2,0.2);
        mat4_scale(&local_a98,vVar46);
        mat4_multiply_n((mat4 *)local_1148,4);
        local_4c8[0] = local_1118[0];
        local_4c8[1] = local_1118[1];
        aiStack_4c0[0] = aiStack_1110[0];
        aiStack_4c0[1] = aiStack_1110[1];
        local_4d8[0] = local_1128[0];
        local_4d8[1] = local_1128[1];
        local_4d8[2] = local_1128[2];
        local_4d8[3] = local_1128[3];
        local_4d8[4] = local_1128[4];
        local_4d8[5] = local_1128[5];
        local_4d8[6] = local_1128[6];
        local_4d8[7] = local_1128[7];
        aiStack_4d0[0] = aiStack_1120[0];
        aiStack_4d0[1] = aiStack_1120[1];
        local_4e8[0].id = local_1138[0].id;
        local_4e8[1].id = local_1138[1].id;
        asStack_4e0[0].id = asStack_1130[0].id;
        asStack_4e0[1].id = asStack_1130[1].id;
        local_4f8 = (undefined1  [8])local_1148._0_8_;
        sStack_4f0.id = local_1148._8_4_;
        sStack_4ec.id = local_1148._12_4_;
        local_1148._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
        local_1148._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_1138[0].id = (uint32_t)(graphics->proj_view_mat).m[4];
        local_1138[1].id = (uint32_t)(graphics->proj_view_mat).m[5];
        asStack_1130 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 6);
        local_1128._0_4_ = (graphics->proj_view_mat).m[8];
        local_1128._4_4_ = (graphics->proj_view_mat).m[9];
        aiStack_1120 = *(int (*) [2])((graphics->proj_view_mat).m + 10);
        local_1118 = *(int (*) [2])((graphics->proj_view_mat).m + 0xc);
        aiStack_1110 = *(int (*) [2])((graphics->proj_view_mat).m + 0xe);
        m_11.m[3] = (float)SUB84(local_1148._8_8_,4);
        m_11.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m_11.m[4] = (float)local_1138[0].id;
        m_11.m[5] = (float)local_1138[1].id;
        m_11.m[6] = (float)asStack_1130[0].id;
        m_11.m[7] = (float)asStack_1130[1].id;
        m_11.m[8] = local_1128._0_4_;
        m_11.m[9] = local_1128._4_4_;
        m_11.m[10] = (float)aiStack_1120[0];
        m_11.m[0xb] = (float)aiStack_1120[1];
        m_11.m[0xc] = (float)local_1118[0];
        m_11.m[0xd] = (float)local_1118[1];
        m_11.m[0xe] = (float)aiStack_1110[0];
        m_11.m[0xf] = aiStack_1110[1];
        mat4_transpose(m_11);
        m_12.m[2] = (float)(int)uStack_ad0;
        m_12.m[0] = (float)(undefined4)local_ad8;
        m_12.m[1] = (float)local_ad8._4_4_;
        m_12.m[3] = (float)(int)((ulong)uStack_ad0 >> 0x20);
        m_12.m[4] = (float)(int)local_ac8;
        m_12.m[5] = (float)(int)((ulong)local_ac8 >> 0x20);
        m_12.m[6] = (float)(int)uStack_ac0;
        m_12.m[7] = (float)(int)((ulong)uStack_ac0 >> 0x20);
        m_12.m[8] = (float)(int)local_ab8;
        m_12.m[9] = (float)(int)((ulong)local_ab8 >> 0x20);
        m_12.m[10] = (float)(int)uStack_ab0;
        m_12.m[0xb] = (float)(int)((ulong)uStack_ab0 >> 0x20);
        m_12.m[0xc] = (float)(int)local_aa8;
        m_12.m[0xd] = (float)(int)((ulong)local_aa8 >> 0x20);
        m_12.m[0xe] = (float)(int)uStack_aa0;
        m_12.m[0xf] = (float)((ulong)uStack_aa0 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_12);
        m_13.m[2] = (float)(uint32_t)_sStack_4f0;
        m_13.m[0] = (float)local_4f8._0_4_;
        m_13.m[1] = (float)local_4f8._4_4_;
        m_13.m[3] = (float)SUB84(_sStack_4f0,4);
        m_13.m[4] = (float)local_4e8[0].id;
        m_13.m[5] = (float)local_4e8[1].id;
        m_13.m[6] = (float)asStack_4e0[0].id;
        m_13.m[7] = (float)asStack_4e0[1].id;
        m_13.m[8] = (float)local_4d8._0_4_;
        m_13.m[9] = (float)local_4d8._4_4_;
        m_13.m[10] = (float)aiStack_4d0[0];
        m_13.m[0xb] = (float)aiStack_4d0[1];
        m_13.m[0xc] = (float)local_4c8[0];
        m_13.m[0xd] = (float)local_4c8[1];
        m_13.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_13.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_13);
        m_14.m[2] = (float)(int)uStack_b10;
        m_14.m[0] = (float)(undefined4)local_b18;
        m_14.m[1] = (float)local_b18._4_4_;
        m_14.m[3] = (float)(int)((ulong)uStack_b10 >> 0x20);
        m_14.m[4] = (float)(int)local_b08;
        m_14.m[5] = (float)(int)((ulong)local_b08 >> 0x20);
        m_14.m[6] = (float)(int)uStack_b00;
        m_14.m[7] = (float)(int)((ulong)uStack_b00 >> 0x20);
        m_14.m[8] = (float)(int)local_af8;
        m_14.m[9] = (float)(int)((ulong)local_af8 >> 0x20);
        m_14.m[10] = (float)(int)uStack_af0;
        m_14.m[0xb] = (float)(int)((ulong)uStack_af0 >> 0x20);
        m_14.m[0xc] = (float)(int)local_ae8;
        m_14.m[0xd] = (float)(int)((ulong)local_ae8 >> 0x20);
        m_14.m[0xe] = (float)(int)uStack_ae0;
        m_14.m[0xf] = (float)((ulong)uStack_ae0 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_14);
        local_f60.ptr = pgVar25->data;
        local_f60.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f60);
        golf_shader_uniform_set_float(uniform,"alpha",1.0);
        local_f70.ptr = uniform->data;
        local_f70.size = (size_t)uniform->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f70);
        aStack_900._36_4_ = (pgVar22->sg_image).id;
        local_958 = (undefined1  [8])((ulong)(pgVar21->sg_positions_buf).id << 0x20);
        sStack_94c.id = (pgVar21->sg_normals_buf).id;
        sStack_950.id = (pgVar21->sg_texcoords_buf).id;
        aStack_900._24_4_ = 0;
        aStack_900._28_8_ = 0;
        aStack_900._8_8_ = 0;
        aStack_900._16_4_ = 0;
        aStack_900._20_4_ = 0;
        local_908._0_4_ = 0;
        local_908._4_4_ = 0;
        aStack_900._0_8_ = 0;
        aiStack_930._24_8_ = 0;
        aiStack_930[8] = 0;
        aiStack_930[9] = 0;
        aiStack_930[2] = 0;
        aiStack_930[3] = 0;
        aiStack_930[4] = 0;
        aiStack_930[5] = 0;
        local_938._0_4_ = 0.0;
        local_938._4_4_ = 0.0;
        aiStack_930[0] = 0;
        aiStack_930[1] = 0;
        local_948._0_4_ = 0.0;
        local_948._4_4_ = 0.0;
        uStack_940._0_4_ = 0;
        uStack_940._4_4_ = 0;
        aStack_900._72_8_ = 0;
        aStack_900._80_8_ = 0;
        aStack_900._56_8_ = 0;
        aStack_900._64_8_ = 0;
        aStack_900._40_8_ = 0;
        aStack_900._48_8_ = 0;
LAB_0010f17b:
        sg_apply_bindings((sg_bindings *)local_958);
        sg_draw(L'\0',(pgVar21->positions).length,L'\x01');
      }
      else if (*(int *)(pgVar39->name + lVar40 + -4) == 1) {
        pgVar21 = golf_data_get_model("data/models/sphere.obj");
        pgVar22 = golf_data_get_texture("data/textures/colors/red.png");
        golf_entity_get_world_transform
                  ((golf_transform_t *)&local_10f8,level,
                   (golf_entity_t *)(pgVar39->name + lVar40 + -0xc));
        vVar46.z = local_10f8.m[2];
        vVar46.x = local_10f8.m[0];
        vVar46.y = local_10f8.m[1];
        mat4_translation(&local_b58,vVar46);
        vVar46 = vec3_create(0.12,0.12,0.12);
        mat4_scale(&local_b98,vVar46);
        mat4_multiply_n((mat4 *)local_4f8,2);
        pgVar23 = golf_data_get_shader("data/shaders/texture_material.glsl");
        pgVar24 = golf_shader_get_pipeline(pgVar23,"texture_material");
        sg_apply_pipeline((sg_pipeline)(pgVar24->sg_pipeline).id);
        pgVar25 = golf_shader_get_vs_uniform(pgVar23,"texture_material_vs_params");
        local_958 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
        _sStack_950 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_948._0_4_ = (graphics->proj_view_mat).m[4];
        local_948._4_4_ = (graphics->proj_view_mat).m[5];
        uStack_940 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_938._0_4_ = (graphics->proj_view_mat).m[8];
        local_938._4_4_ = (graphics->proj_view_mat).m[9];
        aiStack_930._0_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        aiStack_930._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
        aiStack_930._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        m_15.m[3] = (float)SUB84(_sStack_950,4);
        m_15.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m_15.m[4] = (float)local_948;
        m_15.m[5] = local_948._4_4_;
        m_15.m[6] = (float)(uint32_t)uStack_940;
        m_15.m[7] = (float)SUB84(uStack_940,4);
        m_15.m[8] = (float)local_938;
        m_15.m[9] = local_938._4_4_;
        m_15.m[10] = (float)(int)aiStack_930._0_8_;
        m_15.m[0xb] = (float)SUB84(aiStack_930._0_8_,4);
        m_15.m[0xc] = (float)(int)aiStack_930._8_8_;
        m_15.m[0xd] = (float)SUB84(aiStack_930._8_8_,4);
        m_15.m[0xe] = (float)(int)aiStack_930._16_8_;
        m_15.m[0xf] = SUB84(aiStack_930._16_8_,4);
        mat4_transpose(m_15);
        m_16.m[2] = (float)(int)uStack_bd0;
        m_16.m[0] = (float)(undefined4)local_bd8;
        m_16.m[1] = (float)local_bd8._4_4_;
        m_16.m[3] = (float)(int)((ulong)uStack_bd0 >> 0x20);
        m_16.m[4] = (float)(int)local_bc8;
        m_16.m[5] = (float)(int)((ulong)local_bc8 >> 0x20);
        m_16.m[6] = (float)(int)uStack_bc0;
        m_16.m[7] = (float)(int)((ulong)uStack_bc0 >> 0x20);
        m_16.m[8] = (float)(int)local_bb8;
        m_16.m[9] = (float)(int)((ulong)local_bb8 >> 0x20);
        m_16.m[10] = (float)(int)uStack_bb0;
        m_16.m[0xb] = (float)(int)((ulong)uStack_bb0 >> 0x20);
        m_16.m[0xc] = (float)(int)local_ba8;
        m_16.m[0xd] = (float)(int)((ulong)local_ba8 >> 0x20);
        m_16.m[0xe] = (float)(int)uStack_ba0;
        m_16.m[0xf] = (float)((ulong)uStack_ba0 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_16);
        m_17.m[2] = (float)(uint32_t)_sStack_4f0;
        m_17.m[0] = (float)local_4f8._0_4_;
        m_17.m[1] = (float)local_4f8._4_4_;
        m_17.m[3] = (float)SUB84(_sStack_4f0,4);
        m_17.m[4] = (float)local_4e8[0].id;
        m_17.m[5] = (float)local_4e8[1].id;
        m_17.m[6] = (float)asStack_4e0[0].id;
        m_17.m[7] = (float)asStack_4e0[1].id;
        m_17.m[8] = (float)local_4d8._0_4_;
        m_17.m[9] = (float)local_4d8._4_4_;
        m_17.m[10] = (float)aiStack_4d0[0];
        m_17.m[0xb] = (float)aiStack_4d0[1];
        m_17.m[0xc] = (float)local_4c8[0];
        m_17.m[0xd] = (float)local_4c8[1];
        m_17.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_17.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_17);
        m_18.m[2] = (float)(int)uStack_c10;
        m_18.m[0] = (float)(undefined4)local_c18;
        m_18.m[1] = (float)local_c18._4_4_;
        m_18.m[3] = (float)(int)((ulong)uStack_c10 >> 0x20);
        m_18.m[4] = (float)(int)local_c08;
        m_18.m[5] = (float)(int)((ulong)local_c08 >> 0x20);
        m_18.m[6] = (float)(int)uStack_c00;
        m_18.m[7] = (float)(int)((ulong)uStack_c00 >> 0x20);
        m_18.m[8] = (float)(int)local_bf8;
        m_18.m[9] = (float)(int)((ulong)local_bf8 >> 0x20);
        m_18.m[10] = (float)(int)uStack_bf0;
        m_18.m[0xb] = (float)(int)((ulong)uStack_bf0 >> 0x20);
        m_18.m[0xc] = (float)(int)local_be8;
        m_18.m[0xd] = (float)(int)((ulong)local_be8 >> 0x20);
        m_18.m[0xe] = (float)(int)uStack_be0;
        m_18.m[0xf] = (float)((ulong)uStack_be0 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_18);
        local_f80.ptr = pgVar25->data;
        local_f80.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f80);
        pgVar25 = golf_shader_get_fs_uniform(pgVar23,"fs_params");
        golf_shader_uniform_set_float(pgVar25,"alpha",1.0);
        local_f90.ptr = pgVar25->data;
        local_f90.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f90);
        memset(local_958,0,0xb0);
        local_958._4_4_ = (pgVar21->sg_positions_buf).id;
        sStack_94c.id = (pgVar21->sg_normals_buf).id;
        sStack_950.id = (pgVar21->sg_texcoords_buf).id;
        aStack_900._36_4_ = (pgVar22->sg_image).id;
        goto LAB_0010f17b;
      }
      lVar31 = lVar31 + 1;
      lVar40 = lVar40 + 0x510;
    } while (lVar31 < (level->entities).length);
  }
  pgVar23 = golf_data_get_shader("data/shaders/editor_water.glsl");
  pgVar24 = golf_shader_get_pipeline(pgVar23,"editor_water");
  sg_apply_pipeline((sg_pipeline)(pgVar24->sg_pipeline).id);
  if (0 < (level->entities).length) {
    lVar31 = 0;
    lVar40 = 0;
    do {
      pgVar39 = (level->entities).data;
      if ((pgVar39->name[lVar31 + -0xc] == '\x01') && (*(int *)(pgVar39->name + lVar31 + -4) == 4))
      {
        pgVar39 = (golf_entity_t *)(pgVar39->name + lVar31 + -0xc);
        pgVar21 = golf_entity_get_model(pgVar39);
        golf_entity_get_world_transform(&local_de0,level,pgVar39);
        golf_transform_get_model_mat(in_stack_ffffffffffffeb60);
        pgVar22 = golf_data_get_texture("data/textures/colors/white.png");
        pgVar26 = golf_data_get_texture("data/textures/water_noise_1.png");
        pgVar27 = golf_data_get_texture("data/textures/water_noise_2.png");
        pgVar28 = golf_entity_get_lightmap_section(pgVar39);
        memset(local_958,0,0xb0);
        local_958._4_4_ = (pgVar21->sg_positions_buf).id;
        sStack_94c.id = (pgVar28->sg_uvs_buf).id;
        sStack_950.id = (pgVar21->sg_texcoords_buf).id;
        aStack_900._36_4_ = (pgVar22->sg_image).id;
        aStack_900._44_4_ = (pgVar27->sg_image).id;
        aStack_900._40_4_ = (pgVar26->sg_image).id;
        sg_apply_bindings((sg_bindings *)local_958);
        pgVar25 = golf_shader_get_vs_uniform(pgVar23,"editor_water_vs_params");
        m_19.m[2] = (float)(uint32_t)_sStack_4f0;
        m_19.m[0] = (float)local_4f8._0_4_;
        m_19.m[1] = (float)local_4f8._4_4_;
        m_19.m[3] = (float)SUB84(_sStack_4f0,4);
        m_19.m[4] = (float)local_4e8[0].id;
        m_19.m[5] = (float)local_4e8[1].id;
        m_19.m[6] = (float)asStack_4e0[0].id;
        m_19.m[7] = (float)asStack_4e0[1].id;
        m_19.m[8] = (float)local_4d8._0_4_;
        m_19.m[9] = (float)local_4d8._4_4_;
        m_19.m[10] = (float)aiStack_4d0[0];
        m_19.m[0xb] = (float)aiStack_4d0[1];
        m_19.m[0xc] = (float)local_4c8[0];
        m_19.m[0xd] = (float)local_4c8[1];
        m_19.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_19.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_19);
        m_20.m[2] = local_10f8.m[2];
        m_20.m[0] = local_10f8.m[0];
        m_20.m[1] = local_10f8.m[1];
        m_20.m[3] = local_10f8.m[3];
        m_20.m[4] = local_10f8.m[4];
        m_20.m[5] = local_10f8.m[5];
        m_20.m[6] = (float)local_10f8.m[6];
        m_20.m[7] = (float)local_10f8.m[7];
        m_20.m[8] = local_10f8.m[8];
        m_20.m[9] = local_10f8.m[9];
        m_20.m[10] = (float)local_10f8.m[10];
        m_20.m[0xb] = (float)local_10f8.m[0xb];
        m_20.m[0xc] = (float)local_10f8.m[0xc];
        m_20.m[0xd] = (float)local_10f8.m[0xd];
        m_20.m[0xe] = (float)local_10f8.m[0xe];
        m_20.m[0xf] = local_10f8.m[0xf];
        golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_20);
        pmVar35 = &graphics->proj_view_mat;
        local_10b8.position.x = pmVar35->m[0];
        local_10b8.position.y = pmVar35->m[1];
        uVar10 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_10b8.rotation.y = (graphics->proj_view_mat).m[4];
        local_10b8.rotation.z = (graphics->proj_view_mat).m[5];
        uVar11 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_10b8.scale.y = (graphics->proj_view_mat).m[8];
        local_10b8.scale.z = (graphics->proj_view_mat).m[9];
        uStack_1090 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        local_1088 = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
        uStack_1080 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        local_10b8.rotation.w = (float)uVar11;
        local_10b8.scale.x = (float)((ulong)uVar11 >> 0x20);
        local_10b8.position.z = (float)uVar10;
        local_10b8.rotation.x = (float)((ulong)uVar10 >> 0x20);
        m_21.m[3] = local_10b8.rotation.x;
        m_21.m._0_12_ = *(undefined1 (*) [12])pmVar35->m;
        m_21.m[4] = local_10b8.rotation.y;
        m_21.m[5] = local_10b8.rotation.z;
        m_21.m[6] = local_10b8.rotation.w;
        m_21.m[7] = local_10b8.scale.x;
        m_21.m[8] = local_10b8.scale.y;
        m_21.m[9] = local_10b8.scale.z;
        m_21.m[10] = (float)(int)uStack_1090;
        m_21.m[0xb] = (float)(int)((ulong)uStack_1090 >> 0x20);
        m_21.m[0xc] = (float)(int)local_1088;
        m_21.m[0xd] = (float)(int)((ulong)local_1088 >> 0x20);
        m_21.m[0xe] = (float)(int)uStack_1080;
        m_21.m[0xf] = (float)((ulong)uStack_1080 >> 0x20);
        mat4_transpose(m_21);
        m_22.m[2] = (float)(uint32_t)local_1148._8_8_;
        m_22.m[0] = (float)local_1148._0_4_;
        m_22.m[1] = (float)local_1148._4_4_;
        m_22.m[3] = (float)SUB84(local_1148._8_8_,4);
        m_22.m[4] = local_1138[0].id;
        m_22.m[5] = local_1138[1].id;
        m_22.m[6] = (float)asStack_1130[0].id;
        m_22.m[7] = (float)asStack_1130[1].id;
        m_22.m[8] = local_1128._0_4_;
        m_22.m[9] = local_1128._4_4_;
        m_22.m[10] = (float)aiStack_1120[0];
        m_22.m[0xb] = (float)aiStack_1120[1];
        m_22.m[0xc] = (float)local_1118[0];
        m_22.m[0xd] = (float)local_1118[1];
        m_22.m[0xe] = (float)aiStack_1110[0];
        m_22.m[0xf] = aiStack_1110[1];
        golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_22);
        local_fa0.ptr = pgVar25->data;
        local_fa0.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fa0);
        pgVar25 = golf_shader_get_fs_uniform(pgVar23,"editor_water_fs_params");
        golf_shader_uniform_set_float(pgVar25,"draw_type",0.0);
        golf_shader_uniform_set_float(pgVar25,"t",editor->t);
        local_fb0.ptr = pgVar25->data;
        local_fb0.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_fb0);
        sg_draw(L'\0',(pgVar21->positions).length,L'\x01');
      }
      lVar40 = lVar40 + 1;
      lVar31 = lVar31 + 0x510;
    } while (lVar40 < (level->entities).length);
  }
  pgVar23 = golf_data_get_shader("data/shaders/pass_through.glsl");
  pgVar24 = golf_shader_get_pipeline(pgVar23,"hole_pass_1");
  sg_apply_pipeline((sg_pipeline)(pgVar24->sg_pipeline).id);
  if (0 < (level->entities).length) {
    lVar40 = 0;
    lVar31 = 0;
    do {
      pgVar39 = (level->entities).data;
      if ((pgVar39->name[lVar40 + -0xc] == '\x01') && (*(int *)(pgVar39->name + lVar40 + -4) == 2))
      {
        uVar10 = *(undefined8 *)(pgVar39->name + lVar40 + 0x44);
        uStack_1040 = *(undefined8 *)(pgVar39->name + lVar40 + 0x44 + 8);
        local_1038 = *(undefined8 *)(pgVar39->name + lVar40 + 0x54);
        uStack_1030 = *(undefined8 *)(pgVar39->name + lVar40 + 0x54 + 8);
        local_1028 = *(undefined8 *)(pgVar39->name + lVar40 + 100);
        local_1048._4_4_ = (float)((ulong)uVar10 >> 0x20);
        local_1048._0_4_ = (undefined4)uVar10;
        local_1048 = CONCAT44(local_1048._4_4_ + 0.001,(undefined4)local_1048);
        golf_transform_get_model_mat(in_stack_ffffffffffffeb60);
        pgVar21 = golf_data_get_model("data/models/hole-cover.obj");
        pgVar25 = golf_shader_get_vs_uniform(pgVar23,"pass_through_vs_params");
        local_958 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
        _sStack_950 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_948._0_4_ = (graphics->proj_view_mat).m[4];
        local_948._4_4_ = (graphics->proj_view_mat).m[5];
        uStack_940 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_938._0_4_ = (graphics->proj_view_mat).m[8];
        local_938._4_4_ = (graphics->proj_view_mat).m[9];
        aiStack_930._0_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        aiStack_930._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
        aiStack_930._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        m1.m[3] = (float)SUB84(_sStack_950,4);
        m1.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m1.m[4] = (float)local_948;
        m1.m[5] = local_948._4_4_;
        m1.m[6] = (float)(uint32_t)uStack_940;
        m1.m[7] = (float)SUB84(uStack_940,4);
        m1.m[8] = (float)local_938;
        m1.m[9] = local_938._4_4_;
        m1.m[10] = (float)(int)aiStack_930._0_8_;
        m1.m[0xb] = (float)SUB84(aiStack_930._0_8_,4);
        m1.m[0xc] = (float)(int)aiStack_930._8_8_;
        m1.m[0xd] = (float)SUB84(aiStack_930._8_8_,4);
        m1.m[0xe] = (float)(int)aiStack_930._16_8_;
        m1.m[0xf] = SUB84(aiStack_930._16_8_,4);
        m2.m[2] = (float)sStack_4f0.id;
        m2.m[3] = (float)sStack_4ec.id;
        m2.m[0] = (float)local_4f8._0_4_;
        m2.m[1] = (float)local_4f8._4_4_;
        m2.m[4] = (float)local_4e8[0].id;
        m2.m[5] = (float)local_4e8[1].id;
        m2.m[6] = (float)asStack_4e0[0].id;
        m2.m[7] = (float)asStack_4e0[1].id;
        m2.m._32_8_ = local_4d8;
        m2.m[10] = (float)aiStack_4d0[0];
        m2.m[0xb] = (float)aiStack_4d0[1];
        m2.m[0xc] = (float)local_4c8[0];
        m2.m[0xd] = (float)local_4c8[1];
        m2.m[0xe] = (float)aiStack_4c0[0];
        m2.m[0xf] = (float)aiStack_4c0[1];
        mat4_multiply(m1,m2);
        m_23.m[2] = local_de0.position.z;
        m_23.m[0] = local_de0.position.x;
        m_23.m[1] = local_de0.position.y;
        m_23.m[3] = local_de0.rotation.x;
        m_23.m[4] = local_de0.rotation.y;
        m_23.m[5] = local_de0.rotation.z;
        m_23.m[6] = local_de0.rotation.w;
        m_23.m[7] = local_de0.scale.x;
        m_23.m[8] = local_de0.scale.y;
        m_23.m[9] = local_de0.scale.z;
        m_23.m[10] = (float)(int)uStack_db8;
        m_23.m[0xb] = (float)(int)((ulong)uStack_db8 >> 0x20);
        m_23.m[0xc] = (float)(int)local_db0;
        m_23.m[0xd] = (float)(int)((ulong)local_db0 >> 0x20);
        m_23.m[0xe] = (float)(int)uStack_da8;
        m_23.m[0xf] = (float)((ulong)uStack_da8 >> 0x20);
        mat4_transpose(m_23);
        m_24.m[2] = local_10b8.position.z;
        m_24.m[0] = local_10b8.position.x;
        m_24.m[1] = local_10b8.position.y;
        m_24.m[3] = local_10b8.rotation.x;
        m_24.m[4] = local_10b8.rotation.y;
        m_24.m[5] = local_10b8.rotation.z;
        m_24.m[6] = local_10b8.rotation.w;
        m_24.m[7] = local_10b8.scale.x;
        m_24.m[8] = local_10b8.scale.y;
        m_24.m[9] = local_10b8.scale.z;
        m_24.m[10] = (float)(int)uStack_1090;
        m_24.m[0xb] = (float)(int)((ulong)uStack_1090 >> 0x20);
        m_24.m[0xc] = (float)(int)local_1088;
        m_24.m[0xd] = (float)(int)((ulong)local_1088 >> 0x20);
        m_24.m[0xe] = (float)(int)uStack_1080;
        m_24.m[0xf] = (float)((ulong)uStack_1080 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"mvp_mat",m_24);
        local_fc0.ptr = pgVar25->data;
        local_fc0.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fc0);
        memset((sg_bindings *)local_958,0,0xb0);
        local_958._4_4_ = (pgVar21->sg_positions_buf).id;
        sg_apply_bindings((sg_bindings *)local_958);
        sg_draw(L'\0',(pgVar21->positions).length,L'\x01');
      }
      lVar31 = lVar31 + 1;
      lVar40 = lVar40 + 0x510;
    } while (lVar31 < (level->entities).length);
  }
  pgVar23 = golf_data_get_shader("data/shaders/texture_material.glsl");
  pgVar24 = golf_shader_get_pipeline(pgVar23,"hole_pass_2");
  sg_apply_pipeline((sg_pipeline)(pgVar24->sg_pipeline).id);
  if (0 < (level->entities).length) {
    lVar31 = 0;
    lVar40 = 0;
    do {
      pgVar39 = (level->entities).data;
      if ((pgVar39->name[lVar31 + -0xc] == '\x01') && (*(int *)(pgVar39->name + lVar31 + -4) == 2))
      {
        uVar10 = *(undefined8 *)(pgVar39->name + lVar31 + 0x44);
        uStack_1000 = *(undefined8 *)(pgVar39->name + lVar31 + 0x44 + 8);
        local_ff8 = *(undefined8 *)(pgVar39->name + lVar31 + 0x54);
        uStack_ff0 = *(undefined8 *)(pgVar39->name + lVar31 + 0x54 + 8);
        local_fe8 = *(undefined8 *)(pgVar39->name + lVar31 + 100);
        fStack_1004 = (float)((ulong)uVar10 >> 0x20);
        _local_1008 = CONCAT44(fStack_1004 + 0.001,(int)uVar10);
        golf_transform_get_model_mat(in_stack_ffffffffffffeb60);
        pgVar21 = golf_data_get_model("data/models/hole.obj");
        pgVar22 = golf_data_get_texture("data/textures/hole_lightmap.png");
        pgVar25 = golf_shader_get_vs_uniform(pgVar23,"texture_material_vs_params");
        local_958 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
        _sStack_950 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_948._0_4_ = (graphics->proj_view_mat).m[4];
        local_948._4_4_ = (graphics->proj_view_mat).m[5];
        uStack_940 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_938._0_4_ = (graphics->proj_view_mat).m[8];
        local_938._4_4_ = (graphics->proj_view_mat).m[9];
        aiStack_930._0_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        aiStack_930._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
        aiStack_930._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        m_25.m[3] = (float)SUB84(_sStack_950,4);
        m_25.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m_25.m[4] = (float)local_948;
        m_25.m[5] = local_948._4_4_;
        m_25.m[6] = (float)(uint32_t)uStack_940;
        m_25.m[7] = (float)SUB84(uStack_940,4);
        m_25.m[8] = (float)local_938;
        m_25.m[9] = local_938._4_4_;
        m_25.m[10] = (float)(int)aiStack_930._0_8_;
        m_25.m[0xb] = (float)SUB84(aiStack_930._0_8_,4);
        m_25.m[0xc] = (float)(int)aiStack_930._8_8_;
        m_25.m[0xd] = (float)SUB84(aiStack_930._8_8_,4);
        m_25.m[0xe] = (float)(int)aiStack_930._16_8_;
        m_25.m[0xf] = SUB84(aiStack_930._16_8_,4);
        mat4_transpose(m_25);
        m_26.m[2] = (float)(int)uStack_1040;
        m_26.m[0] = (float)(undefined4)local_1048;
        m_26.m[1] = local_1048._4_4_;
        m_26.m[3] = (float)(int)((ulong)uStack_1040 >> 0x20);
        m_26.m[4] = (float)(int)local_1038;
        m_26.m[5] = (float)(int)((ulong)local_1038 >> 0x20);
        m_26.m[6] = (float)(int)uStack_1030;
        m_26.m[7] = (float)(int)((ulong)uStack_1030 >> 0x20);
        m_26.m[8] = (float)(int)local_1028;
        m_26.m[9] = (float)(int)((ulong)local_1028 >> 0x20);
        m_26.m[10] = (float)(int)uStack_1020;
        m_26.m[0xb] = (float)(int)((ulong)uStack_1020 >> 0x20);
        m_26.m[0xc] = (float)(int)local_1018;
        m_26.m[0xd] = (float)(int)((ulong)local_1018 >> 0x20);
        m_26.m[0xe] = (float)(int)uStack_1010;
        m_26.m[0xf] = (float)((ulong)uStack_1010 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"proj_view_mat",m_26);
        m_27.m[2] = (float)(uint32_t)_sStack_4f0;
        m_27.m[0] = (float)local_4f8._0_4_;
        m_27.m[1] = (float)local_4f8._4_4_;
        m_27.m[3] = (float)SUB84(_sStack_4f0,4);
        m_27.m[4] = (float)local_4e8[0].id;
        m_27.m[5] = (float)local_4e8[1].id;
        m_27.m[6] = (float)asStack_4e0[0].id;
        m_27.m[7] = (float)asStack_4e0[1].id;
        m_27.m[8] = (float)local_4d8._0_4_;
        m_27.m[9] = (float)local_4d8._4_4_;
        m_27.m[10] = (float)aiStack_4d0[0];
        m_27.m[0xb] = (float)aiStack_4d0[1];
        m_27.m[0xc] = (float)local_4c8[0];
        m_27.m[0xd] = (float)local_4c8[1];
        m_27.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_27.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_27);
        m_28.m[2] = (float)(int)uStack_c50;
        m_28.m[0] = (float)(undefined4)local_c58;
        m_28.m[1] = (float)local_c58._4_4_;
        m_28.m[3] = (float)(int)((ulong)uStack_c50 >> 0x20);
        m_28.m[4] = (float)(int)local_c48;
        m_28.m[5] = (float)(int)((ulong)local_c48 >> 0x20);
        m_28.m[6] = (float)(int)uStack_c40;
        m_28.m[7] = (float)(int)((ulong)uStack_c40 >> 0x20);
        m_28.m[8] = (float)(int)local_c38;
        m_28.m[9] = (float)(int)((ulong)local_c38 >> 0x20);
        m_28.m[10] = (float)(int)uStack_c30;
        m_28.m[0xb] = (float)(int)((ulong)uStack_c30 >> 0x20);
        m_28.m[0xc] = (float)(int)local_c28;
        m_28.m[0xd] = (float)(int)((ulong)local_c28 >> 0x20);
        m_28.m[0xe] = (float)(int)uStack_c20;
        m_28.m[0xf] = (float)((ulong)uStack_c20 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar25,"model_mat",m_28);
        local_fd0.ptr = pgVar25->data;
        local_fd0.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fd0);
        pgVar25 = golf_shader_get_fs_uniform(pgVar23,"fs_params");
        golf_shader_uniform_set_float(pgVar25,"alpha",1.0);
        local_fe0.ptr = pgVar25->data;
        local_fe0.size = (size_t)pgVar25->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_fe0);
        memset((sg_bindings *)local_958,0,0xb0);
        local_958._4_4_ = (pgVar21->sg_positions_buf).id;
        sStack_94c.id = (pgVar21->sg_normals_buf).id;
        sStack_950.id = (pgVar21->sg_texcoords_buf).id;
        aStack_900._36_4_ = (pgVar22->sg_image).id;
        sg_apply_bindings((sg_bindings *)local_958);
        sg_draw(L'\0',(pgVar21->positions).length,L'\x01');
      }
      lVar40 = lVar40 + 1;
      lVar31 = lVar31 + 0x510;
    } while (lVar40 < (level->entities).length);
  }
  if (editor->in_edit_mode == true) {
    pgVar6 = (editor->edit_mode).geo;
    golf_transform_get_model_mat(in_stack_ffffffffffffeb60);
    if (0 < (pgVar6->points).length) {
      lVar31 = 0;
      lVar40 = 0;
      do {
        pgVar7 = (pgVar6->points).data;
        if (((&pgVar7->active)[lVar31] & 1U) != 0) {
          m_29.m[2] = (float)(uint32_t)_sStack_4f0;
          m_29.m[0] = (float)local_4f8._0_4_;
          m_29.m[1] = (float)local_4f8._4_4_;
          m_29.m[3] = (float)SUB84(_sStack_4f0,4);
          m_29.m[4] = (float)local_4e8[0].id;
          m_29.m[5] = (float)local_4e8[1].id;
          m_29.m[6] = (float)asStack_4e0[0].id;
          m_29.m[7] = (float)asStack_4e0[1].id;
          m_29.m[8] = (float)local_4d8._0_4_;
          m_29.m[9] = (float)local_4d8._4_4_;
          m_29.m[10] = (float)aiStack_4d0[0];
          m_29.m[0xb] = (float)aiStack_4d0[1];
          m_29.m[0xc] = (float)local_4c8[0];
          m_29.m[0xd] = (float)local_4c8[1];
          m_29.m[0xe] = (float)(int)aiStack_4c0._0_8_;
          m_29.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
          v_02.z = *(float *)((long)&(pgVar7->position).z + lVar31);
          v_02._0_8_ = *(undefined8 *)((long)&(pgVar7->position).x + lVar31);
          vVar46 = vec3_apply_mat4(v_02,1.0,m_29);
          fVar44 = golf_config_get_num(cfg,"edit_mode_sphere_size");
          mat4_translation(&local_c98,vVar46);
          vVar46 = vec3_create(fVar44,fVar44,fVar44);
          mat4_scale(&local_cd8,vVar46);
          mat4_multiply_n((mat4 *)&local_ed0,2);
          pgVar21 = golf_data_get_model("data/models/sphere.obj");
          iVar5 = (pgVar21->positions).length;
          vVar46 = golf_config_get_vec3(cfg,"edit_mode_selectable_color");
          fVar44 = vVar46.z;
          gVar49 = golf_edit_mode_entity_point((int)lVar40);
          _Var17 = golf_editor_is_edit_entity_hovered(gVar49);
          pcVar33 = "edit_mode_hovered_color";
          if (_Var17) {
LAB_0010fd38:
            vVar46 = golf_config_get_vec3(cfg,pcVar33);
            fVar44 = vVar46.z;
            local_11a8 = vVar46.x;
            fStack_11a4 = vVar46.y;
          }
          else {
            _Var17 = golf_editor_is_edit_entity_selected(gVar49);
            pcVar33 = "edit_mode_selected_color";
            if (_Var17) goto LAB_0010fd38;
            local_11a8 = vVar46.x;
            fStack_11a4 = vVar46.y;
          }
          vVar48 = vec4_create(local_11a8,fStack_11a4,fVar44,1.0);
          golf_material_color((golf_material_t *)local_958,"",0.0,0.0,0.0,vVar48);
          pgVar34 = (golf_material_t *)local_958;
          puVar36 = (undefined8 *)&stack0xffffffffffffe9f8;
          for (lVar30 = 0x8c; lVar30 != 0; lVar30 = lVar30 + -1) {
            *puVar36 = *(undefined8 *)pgVar34;
            pgVar34 = (golf_material_t *)((long)pgVar34 + (ulong)bVar42 * -0x10 + 8);
            puVar36 = puVar36 + (ulong)bVar42 * -2 + 1;
          }
          _golf_renderer_draw_solid_color_material(pgVar21,0,iVar5);
        }
        lVar40 = lVar40 + 1;
        lVar31 = lVar31 + 0x10;
      } while (lVar40 < (pgVar6->points).length);
    }
    if (0 < (pgVar6->faces).length) {
      local_1070 = &pgVar6->model;
      lVar31 = 0;
      do {
        pgVar8 = (pgVar6->faces).data;
        if ((pgVar8[lVar31].active & 1U) != 0) {
          uVar37 = pgVar8[lVar31].idx.length;
          iVar5 = pgVar8[lVar31].start_vertex_in_model;
          local_1050 = lVar31;
          if (0 < (int)uVar37) {
            piVar9 = pgVar8[lVar31].idx.data;
            uVar20 = 1;
            do {
              iVar38 = piVar9[uVar20 - 1];
              uVar29 = 0;
              if (uVar20 != uVar37) {
                uVar29 = uVar20;
              }
              point1_idx = piVar9[uVar29];
              pgVar7 = (pgVar6->points).data;
              uVar1 = pgVar7[iVar38].position.x;
              uVar3 = pgVar7[iVar38].position.y;
              v_03.y = (float)uVar3;
              v_03.x = (float)uVar1;
              uVar2 = pgVar7[point1_idx].position.x;
              uVar4 = pgVar7[point1_idx].position.y;
              v_04.y = (float)uVar4;
              v_04.x = (float)uVar2;
              fVar44 = pgVar7[point1_idx].position.z;
              m_30.m[2] = (float)(uint32_t)_sStack_4f0;
              m_30.m[0] = (float)local_4f8._0_4_;
              m_30.m[1] = (float)local_4f8._4_4_;
              m_30.m[3] = (float)SUB84(_sStack_4f0,4);
              m_30.m[4] = (float)local_4e8[0].id;
              m_30.m[5] = (float)local_4e8[1].id;
              m_30.m[6] = (float)asStack_4e0[0].id;
              m_30.m[7] = (float)asStack_4e0[1].id;
              m_30.m[8] = (float)local_4d8._0_4_;
              m_30.m[9] = (float)local_4d8._4_4_;
              m_30.m[10] = (float)aiStack_4d0[0];
              m_30.m[0xb] = (float)aiStack_4d0[1];
              m_30.m[0xc] = (float)local_4c8[0];
              m_30.m[0xd] = (float)local_4c8[1];
              m_30.m[0xe] = (float)(int)aiStack_4c0._0_8_;
              m_30.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
              v_03.z = pgVar7[iVar38].position.z;
              vVar46 = vec3_apply_mat4(v_03,1.0,m_30);
              m_31.m[2] = (float)(uint32_t)_sStack_4f0;
              m_31.m[0] = (float)local_4f8._0_4_;
              m_31.m[1] = (float)local_4f8._4_4_;
              m_31.m[3] = (float)SUB84(_sStack_4f0,4);
              m_31.m[4] = (float)local_4e8[0].id;
              m_31.m[5] = (float)local_4e8[1].id;
              m_31.m[6] = (float)asStack_4e0[0].id;
              m_31.m[7] = (float)asStack_4e0[1].id;
              m_31.m[8] = (float)local_4d8._0_4_;
              m_31.m[9] = (float)local_4d8._4_4_;
              m_31.m[10] = (float)aiStack_4d0[0];
              m_31.m[0xb] = (float)aiStack_4d0[1];
              m_31.m[0xc] = (float)local_4c8[0];
              m_31.m[0xd] = (float)local_4c8[1];
              m_31.m[0xe] = (float)(int)aiStack_4c0._0_8_;
              m_31.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
              v_04.z = fVar44;
              vVar47 = vec3_apply_mat4(v_04,1.0,m_31);
              local_1068._8_4_ = extraout_XMM0_Dc;
              local_1068._0_8_ = vVar47._0_8_;
              local_1068._12_4_ = extraout_XMM0_Dd;
              local_1100 = (golf_texture_t *)CONCAT44(local_1100._4_4_,vVar47.z);
              fVar44 = golf_config_get_num(cfg,"edit_mode_line_size");
              local_1108 = (golf_lightmap_section_t *)CONCAT44(local_1108._4_4_,fVar44);
              vVar47 = golf_config_get_vec3(cfg,"edit_mode_selectable_color");
              fVar44 = vVar47.z;
              local_1198 = vVar47._0_8_;
              gVar49 = golf_edit_mode_entity_line(iVar38,point1_idx);
              _Var17 = golf_editor_is_edit_entity_hovered(gVar49);
              pcVar33 = "edit_mode_hovered_color";
              if (_Var17) {
LAB_00110006:
                vVar47 = golf_config_get_vec3(cfg,pcVar33);
                fVar44 = vVar47.z;
                local_1198 = vVar47._0_8_;
                fVar43 = local_1108._0_4_ + 0.001;
              }
              else {
                _Var17 = golf_editor_is_edit_entity_selected(gVar49);
                pcVar33 = "edit_mode_selected_color";
                if (_Var17) goto LAB_00110006;
                fVar43 = local_1108._0_4_;
              }
              auVar16 = local_1068;
              p1.z = local_1100._0_4_;
              p1.x = (float)local_1068._0_4_;
              p1.y = (float)local_1068._4_4_;
              local_1068 = auVar16;
              mat4_box_to_line_transform((mat4 *)&local_ed0,vVar46,p1,fVar43);
              pgVar21 = golf_data_get_model("data/models/cube.obj");
              iVar38 = (pgVar21->positions).length;
              vVar48 = vec4_create((float)local_1198,local_1198._4_4_,fVar44,1.0);
              golf_material_color((golf_material_t *)local_958,"",0.0,0.0,0.0,vVar48);
              pgVar34 = (golf_material_t *)local_958;
              puVar36 = (undefined8 *)&stack0xffffffffffffe9f8;
              for (lVar31 = 0x8c; lVar31 != 0; lVar31 = lVar31 + -1) {
                *puVar36 = *(undefined8 *)pgVar34;
                pgVar34 = (golf_material_t *)((long)pgVar34 + (ulong)bVar42 * -0x10 + 8);
                puVar36 = puVar36 + (ulong)bVar42 * -2 + 1;
              }
              _golf_renderer_draw_solid_color_material(pgVar21,0,iVar38);
              bVar41 = uVar20 != uVar37;
              uVar20 = uVar20 + 1;
            } while (bVar41);
          }
          lVar31 = local_1050;
          gVar49 = golf_edit_mode_entity_face((int)local_1050);
          _Var17 = golf_editor_is_edit_entity_hovered(gVar49);
          if (_Var17) {
            vVar46 = golf_config_get_vec3(cfg,"edit_mode_hovered_color");
            fVar44 = golf_config_get_num(cfg,"edit_mode_hovered_face_alpha");
            local_11a8 = vVar46.x;
            fStack_11a4 = vVar46.y;
            vVar48 = vec4_create(local_11a8,fStack_11a4,vVar46.z,fVar44);
            golf_material_color((golf_material_t *)local_958,"",0.0,0.0,0.0,vVar48);
            pgVar34 = (golf_material_t *)local_958;
            puVar36 = (undefined8 *)&stack0xffffffffffffe9f8;
            for (lVar40 = 0x8c; lVar40 != 0; lVar40 = lVar40 + -1) {
              *puVar36 = *(undefined8 *)pgVar34;
              pgVar34 = (golf_material_t *)((long)pgVar34 + (ulong)bVar42 * -0x10 + 8);
              puVar36 = puVar36 + (ulong)bVar42 * -2 + 1;
            }
            _golf_renderer_draw_solid_color_material(local_1070,iVar5,uVar37 * 3 + -6);
          }
          else {
            _Var17 = golf_editor_is_edit_entity_selected(gVar49);
            if (_Var17) {
              vVar46 = golf_config_get_vec3(cfg,"edit_mode_selected_color");
              fVar44 = golf_config_get_num(cfg,"edit_mode_selected_face_alpha");
              local_11a8 = vVar46.x;
              fStack_11a4 = vVar46.y;
              vVar48 = vec4_create(local_11a8,fStack_11a4,vVar46.z,fVar44);
              golf_material_color((golf_material_t *)local_958,"",0.0,0.0,0.0,vVar48);
              pgVar34 = (golf_material_t *)local_958;
              puVar36 = (undefined8 *)&stack0xffffffffffffe9f8;
              for (lVar40 = 0x8c; lVar40 != 0; lVar40 = lVar40 + -1) {
                *puVar36 = *(undefined8 *)pgVar34;
                pgVar34 = (golf_material_t *)((long)pgVar34 + (ulong)bVar42 * -0x10 + 8);
                puVar36 = puVar36 + (ulong)bVar42 * -2 + 1;
              }
              _golf_renderer_draw_solid_color_material(local_1070,iVar5,uVar37 * 3 + -6);
            }
          }
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 < (pgVar6->faces).length);
    }
  }
  sg_end_pass();
  return;
}

Assistant:

void golf_editor_draw(void) {
    golf_config_t *editor_cfg = golf_data_get_config("data/config/editor.cfg");

    sg_pass_action action = {
        .colors[0] = {
            .action = SG_ACTION_CLEAR,
            .value = { 0, 0, 0, 1 },
        },
    };
    sg_begin_default_pass(&action, (int)graphics->viewport_size.x, (int)graphics->viewport_size.y);

    _draw_level();

    if (editor->in_edit_mode) {
        golf_geo_t *geo = editor->edit_mode.geo;
        mat4 model_mat = golf_transform_get_model_mat(editor->edit_mode.transform);

        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t p = geo->points.data[i];
            if (!p.active) continue;

            vec3 pos = vec3_apply_mat4(p.position, 1, model_mat);
            float sz = CFG_NUM(editor_cfg, "edit_mode_sphere_size");
            mat4 sphere_model_mat = mat4_multiply_n(2, mat4_translation(pos), mat4_scale(V3(sz, sz, sz)));
            golf_model_t *model = golf_data_get_model("data/models/sphere.obj");
            int start = 0;
            int count = model->positions.length;
            vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
            golf_edit_mode_entity_t entity = golf_edit_mode_entity_point(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {  
                color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
            }
            golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
            _golf_renderer_draw_solid_color_material(model, start, count, sphere_model_mat, material);
        }

        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];
            if (!face.active) continue;

            int n = face.idx.length;
            for (int i = 0; i < n; i++) {
                int idx0 = face.idx.data[i];
                int idx1 = face.idx.data[(i + 1) % n];
                golf_geo_point_t p0 = geo->points.data[idx0];
                golf_geo_point_t p1 = geo->points.data[idx1];
                vec3 pos0 = vec3_apply_mat4(p0.position, 1, model_mat);
                vec3 pos1 = vec3_apply_mat4(p1.position, 1, model_mat);
                //vec3 pos_avg = vec3_scale(vec3_add(pos0, pos1), 0.5f);
                float sz = CFG_NUM(editor_cfg, "edit_mode_line_size");
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
                golf_edit_mode_entity_t entity = golf_edit_mode_entity_line(idx0, idx1);
                if (golf_editor_is_edit_entity_hovered(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                    sz += 0.001f;
                }
                else if (golf_editor_is_edit_entity_selected(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                    sz += 0.001f;
                }
                mat4 line_model_mat = mat4_box_to_line_transform(pos0, pos1, sz);
                golf_model_t *model = golf_data_get_model("data/models/cube.obj");
                int start = 0;
                int count = model->positions.length;
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
                _golf_renderer_draw_solid_color_material(model, start, count, line_model_mat, material);
            }

            golf_edit_mode_entity_t entity = golf_edit_mode_entity_face(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_hovered_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_selected_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
        }
    }

    sg_end_pass();
}